

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void Io_Init(Abc_Frame_t *pAbc)

{
  Cmd_CommandAdd(pAbc,"I/O","read",IoCommandRead,1);
  Cmd_CommandAdd(pAbc,"I/O","read_aiger",IoCommandReadAiger,1);
  Cmd_CommandAdd(pAbc,"I/O","read_baf",IoCommandReadBaf,1);
  Cmd_CommandAdd(pAbc,"I/O","read_bblif",IoCommandReadBblif,1);
  Cmd_CommandAdd(pAbc,"I/O","read_blif",IoCommandReadBlif,1);
  Cmd_CommandAdd(pAbc,"I/O","read_blif_mv",IoCommandReadBlifMv,1);
  Cmd_CommandAdd(pAbc,"I/O","read_bench",IoCommandReadBench,1);
  Cmd_CommandAdd(pAbc,"I/O","read_dsd",IoCommandReadDsd,1);
  Cmd_CommandAdd(pAbc,"I/O","read_eqn",IoCommandReadEqn,1);
  Cmd_CommandAdd(pAbc,"I/O","read_init",IoCommandReadInit,1);
  Cmd_CommandAdd(pAbc,"I/O","read_pla",IoCommandReadPla,1);
  Cmd_CommandAdd(pAbc,"I/O","read_truth",IoCommandReadTruth,1);
  Cmd_CommandAdd(pAbc,"I/O","read_verilog",IoCommandReadVerilog,1);
  Cmd_CommandAdd(pAbc,"I/O","read_status",IoCommandReadStatus,0);
  Cmd_CommandAdd(pAbc,"I/O","&read_gig",IoCommandReadGig,0);
  Cmd_CommandAdd(pAbc,"I/O","write",IoCommandWrite,0);
  Cmd_CommandAdd(pAbc,"I/O","write_hie",IoCommandWriteHie,0);
  Cmd_CommandAdd(pAbc,"I/O","write_aiger",IoCommandWriteAiger,0);
  Cmd_CommandAdd(pAbc,"I/O","write_aiger_cex",IoCommandWriteAigerCex,0);
  Cmd_CommandAdd(pAbc,"I/O","write_baf",IoCommandWriteBaf,0);
  Cmd_CommandAdd(pAbc,"I/O","write_bblif",IoCommandWriteBblif,0);
  Cmd_CommandAdd(pAbc,"I/O","write_blif",IoCommandWriteBlif,0);
  Cmd_CommandAdd(pAbc,"I/O","write_blif_mv",IoCommandWriteBlifMv,0);
  Cmd_CommandAdd(pAbc,"I/O","write_bench",IoCommandWriteBench,0);
  Cmd_CommandAdd(pAbc,"I/O","write_book",IoCommandWriteBook,0);
  Cmd_CommandAdd(pAbc,"I/O","write_cellnet",IoCommandWriteCellNet,0);
  Cmd_CommandAdd(pAbc,"I/O","write_cex",IoCommandWriteCex,0);
  Cmd_CommandAdd(pAbc,"I/O","write_cnf",IoCommandWriteCnf,0);
  Cmd_CommandAdd(pAbc,"I/O","&write_cnf",IoCommandWriteCnf2,0);
  Cmd_CommandAdd(pAbc,"I/O","write_dot",IoCommandWriteDot,0);
  Cmd_CommandAdd(pAbc,"I/O","write_eqn",IoCommandWriteEqn,0);
  Cmd_CommandAdd(pAbc,"I/O","write_gml",IoCommandWriteGml,0);
  Cmd_CommandAdd(pAbc,"I/O","write_pla",IoCommandWritePla,0);
  Cmd_CommandAdd(pAbc,"I/O","write_verilog",IoCommandWriteVerilog,0);
  Cmd_CommandAdd(pAbc,"I/O","write_sorter_cnf",IoCommandWriteSortCnf,0);
  Cmd_CommandAdd(pAbc,"I/O","write_truth",IoCommandWriteTruth,0);
  Cmd_CommandAdd(pAbc,"I/O","&write_truths",IoCommandWriteTruths,0);
  Cmd_CommandAdd(pAbc,"I/O","write_status",IoCommandWriteStatus,0);
  Cmd_CommandAdd(pAbc,"I/O","write_smv",IoCommandWriteSmv,0);
  return;
}

Assistant:

void Io_Init( Abc_Frame_t * pAbc )
{
    Cmd_CommandAdd( pAbc, "I/O", "read",          IoCommandRead,         1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_aiger",    IoCommandReadAiger,    1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_baf",      IoCommandReadBaf,      1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_bblif",    IoCommandReadBblif,    1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_blif",     IoCommandReadBlif,     1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_blif_mv",  IoCommandReadBlifMv,   1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_bench",    IoCommandReadBench,    1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_dsd",      IoCommandReadDsd,      1 );
//    Cmd_CommandAdd( pAbc, "I/O", "read_edif",     IoCommandReadEdif,     1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_eqn",      IoCommandReadEqn,      1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_init",     IoCommandReadInit,     1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_pla",      IoCommandReadPla,      1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_truth",    IoCommandReadTruth,    1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_verilog",  IoCommandReadVerilog,  1 );
    Cmd_CommandAdd( pAbc, "I/O", "read_status",   IoCommandReadStatus,   0 );
    Cmd_CommandAdd( pAbc, "I/O", "&read_gig",     IoCommandReadGig,      0 );

    Cmd_CommandAdd( pAbc, "I/O", "write",         IoCommandWrite,        0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_hie",     IoCommandWriteHie,     0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_aiger",   IoCommandWriteAiger,   0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_aiger_cex",   IoCommandWriteAigerCex,   0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_baf",     IoCommandWriteBaf,     0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_bblif",   IoCommandWriteBblif,   0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_blif",    IoCommandWriteBlif,    0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_blif_mv", IoCommandWriteBlifMv,  0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_bench",   IoCommandWriteBench,   0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_book",    IoCommandWriteBook,    0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_cellnet", IoCommandWriteCellNet, 0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_cex",     IoCommandWriteCex,     0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_cnf",     IoCommandWriteCnf,     0 );
    Cmd_CommandAdd( pAbc, "I/O", "&write_cnf",    IoCommandWriteCnf2,    0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_dot",     IoCommandWriteDot,     0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_eqn",     IoCommandWriteEqn,     0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_gml",     IoCommandWriteGml,     0 );
//    Cmd_CommandAdd( pAbc, "I/O", "write_list",    IoCommandWriteList,    0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_pla",     IoCommandWritePla,     0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_verilog", IoCommandWriteVerilog, 0 );
//    Cmd_CommandAdd( pAbc, "I/O", "write_verlib",  IoCommandWriteVerLib,  0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_sorter_cnf", IoCommandWriteSortCnf,  0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_truth",   IoCommandWriteTruth,   0 );
    Cmd_CommandAdd( pAbc, "I/O", "&write_truths", IoCommandWriteTruths,  0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_status",  IoCommandWriteStatus,  0 );
    Cmd_CommandAdd( pAbc, "I/O", "write_smv",     IoCommandWriteSmv,     0 );
}